

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

bool __thiscall
rangeless::fn::impl::eq::operator()
          (eq *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *a,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *b)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (a->first)._M_string_length;
  if (__n == (b->first)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((a->first)._M_dataplus._M_p,(b->first)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(a->second == b->second & bVar2);
}

Assistant:

bool operator()(const T& a, const T& b) const
        {
            return a == b;
        }